

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::MayEmitIfNonDefaultCheck
          (anon_unknown_0 *this,Printer *p,string_view prefix,FieldDescriptor *field,
          AnyInvocable<void_()> *emit_body,bool with_enclosing_braces_always)

{
  bool bVar1;
  long lVar2;
  string *this_00;
  allocator<char> local_24a;
  allocator<char> local_249;
  char *local_248;
  size_type local_240;
  char local_238 [8];
  undefined8 uStack_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  char *local_208;
  size_type local_200;
  char local_1f8 [8];
  undefined8 uStack_1f0;
  FieldDescriptor *field_local;
  Printer *p_local;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  string_view prefix_local;
  undefined1 local_1a0 [64];
  __index_type local_160;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  bool local_138;
  bool local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  field_local = (FieldDescriptor *)prefix._M_str;
  prefix_local._M_str = (char *)prefix._M_len;
  p_local = (Printer *)this;
  prefix_local._M_len = (size_t)p;
  bVar1 = ShouldEmitNonDefaultCheck(field_local);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"condition",&local_24a);
    local_1a0._0_8_ = local_1a0 + 0x10;
    if (local_208 == local_1f8) {
      local_1a0._24_8_ = uStack_1f0;
    }
    else {
      local_1a0._0_8_ = local_208;
    }
    local_1a0._8_8_ = local_200;
    local_200 = 0;
    local_1f8[0] = '\0';
    local_1c8 = (code *)0x0;
    pcStack_1c0 = (code *)0x0;
    local_1d8._M_unused._M_object = (void *)0x0;
    local_1d8._8_8_ = 0;
    local_208 = local_1f8;
    local_1d8._M_unused._M_object = operator_new(0x20);
    *(Printer ***)local_1d8._M_unused._0_8_ = &p_local;
    *(string_view **)((long)local_1d8._M_unused._0_8_ + 8) = &prefix_local;
    *(FieldDescriptor ***)((long)local_1d8._M_unused._0_8_ + 0x10) = &field_local;
    *(code *)((long)local_1d8._M_unused._0_8_ + 0x18) = (code)0x0;
    pcStack_1c0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_1c8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_1a0 + 0x20),
               (function<bool_()> *)&local_1d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
    local_158._M_p = (pointer)&local_148;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_138 = false;
    if (local_160 == '\x01') {
      std::__cxx11::string::assign((char *)&local_158);
    }
    local_f0 = false;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"emit_body",&local_249);
    local_e0 = local_220;
    local_e8 = local_d8;
    if (local_228 == local_218) {
      uStack_d0 = uStack_210;
    }
    else {
      local_e8 = local_228;
    }
    local_220 = 0;
    local_218[0] = 0;
    local_1d8._8_8_ = 0;
    pcStack_1c0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_1c8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_228 = local_218;
    local_1d8._M_unused._M_object = field;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_c8,(function<bool_()> *)&local_1d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    if (local_a8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a0);
    }
    local_38 = 0;
    io::Printer::Emit((Printer *)this,local_1a0,2,0x4b,
                      "\n          if ($condition$) {\n            $emit_body$;\n          }\n        "
                     );
    lVar2 = 0xb8;
    do {
      io::Printer::Sub::~Sub((Sub *)(local_1a0 + lVar2));
      lVar2 = lVar2 + -0xb8;
    } while (lVar2 != -0xb8);
    std::__cxx11::string::~string((string *)&local_228);
    this_00 = (string *)&local_208;
  }
  else {
    if ((char)emit_body == '\0') {
      absl::lts_20250127::internal_any_invocable::Impl<void_()>::operator()((Impl<void_()> *)field);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"emit_body",&local_24a);
    local_1a0._8_8_ = local_240;
    local_1a0._0_8_ = local_1a0 + 0x10;
    if (local_248 == local_238) {
      local_1a0._24_8_ = uStack_230;
    }
    else {
      local_1a0._0_8_ = local_248;
    }
    local_240 = 0;
    local_238[0] = '\0';
    local_1d8._8_8_ = 0;
    pcStack_1c0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_1c8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_248 = local_238;
    local_1d8._M_unused._M_object = field;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_1a0 + 0x20),
               (function<bool_()> *)&local_1d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
    local_158._M_p = (pointer)&local_148;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_138 = false;
    if (local_160 == '\x01') {
      std::__cxx11::string::assign((char *)&local_158);
    }
    local_f0 = false;
    io::Printer::Emit((Printer *)this,local_1a0,1,0x6d,
                      "\n              {\n                //~ Force newline.\n                $emit_body$;\n              }\n            "
                     );
    io::Printer::Sub::~Sub((Sub *)local_1a0);
    this_00 = (string *)&local_248;
  }
  std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

void MayEmitIfNonDefaultCheck(io::Printer* p, absl::string_view prefix,
                              const FieldDescriptor* field,
                              absl::AnyInvocable<void()> emit_body,
                              bool with_enclosing_braces_always) {
  if (ShouldEmitNonDefaultCheck(field)) {
    p->Emit(
        {
            {"condition", [&] { EmitNonDefaultCheck(p, prefix, field); }},
            {"emit_body", [&] { emit_body(); }},
        },
        R"cc(
          if ($condition$) {
            $emit_body$;
          }
        )cc");
    return;
  }

  if (with_enclosing_braces_always) {
    // In repeated fields, the same variable name may be emitted multiple
    // times, hence the need for emitting braces even when the if condition is
    // not necessary, so that the code looks like:
    // {
    //   int tmpvar = ...;
    //   total += tmpvar;
    // }
    // {
    //   int tmpvar = ...;
    //   total += tmpvar;
    // }
    p->Emit({{"emit_body", [&] { emit_body(); }}},
            R"cc(
              {
                //~ Force newline.
                $emit_body$;
              }
            )cc");
    return;
  }

  // If no enclosing braces need to be emitted, just emit the body directly.
  emit_body();
}